

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

HttpOutputStream * __thiscall
kj::anon_unknown_36::HttpEntityBodyWriter::getInner(HttpEntityBodyWriter *this)

{
  HttpOutputStream *pHVar1;
  Fault local_40;
  Fault f_1;
  Fault local_28;
  Fault f;
  HttpOutputStream *i;
  HttpOutputStream *_i2413;
  HttpEntityBodyWriter *this_local;
  
  pHVar1 = kj::_::readMaybe<kj::(anonymous_namespace)::HttpOutputStream>(&this->weakInner);
  if (pHVar1 != (HttpOutputStream *)0x0) {
    return pHVar1;
  }
  if ((this->finished & 1U) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x971,FAILED,(char *)0x0,
               "\"bug in KJ HTTP: tried to access inner stream after it had been released\"",
               (char (*) [72])
               "bug in KJ HTTP: tried to access inner stream after it had been released");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x973,FAILED,(char *)0x0,"\"HTTP body output stream outlived underlying connection\"",
             (char (*) [55])"HTTP body output stream outlived underlying connection");
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

else if (finished) {
      // This is a bug in the implementations in this file, not the app.
      KJ_FAIL_ASSERT("bug in KJ HTTP: tried to access inner stream after it had been released");
    }